

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropagatorTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::propagation::Propagator_testBinaryPropagation_Test::TestBody
          (Propagator_testBinaryPropagation_Test *this)

{
  ulong uVar1;
  mapped_type *pmVar2;
  int iVar3;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen_00;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  long lVar6;
  allocator local_1718 [8];
  AssertionResult gtest_ar;
  ulong local_1700;
  BinaryPropagator binaryPropagator;
  StrMap baggage;
  string value;
  SpanContext ctx;
  stringstream ss;
  ostream local_1530 [376];
  random_device randomDevice;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  randomDevice.field_0.field_0._M_file = (void *)0x0;
  randomDevice.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  BinaryPropagator::BinaryPropagator
            (&binaryPropagator,(shared_ptr<jaegertracing::metrics::Metrics> *)&randomDevice);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&randomDevice.field_0.field_0._M_func);
  std::random_device::random_device(&randomDevice);
  uVar1 = std::random_device::_M_getval();
  iVar3 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  local_1700 = ((ulong)(iVar3 + (uint)(iVar3 == 0)) * 0x41a7) % 0x7fffffff;
  gen = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)(local_1700 % 9);
  baggage._M_h._M_buckets = &baggage._M_h._M_single_bucket;
  baggage._M_h._M_bucket_count = 1;
  baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  baggage._M_h._M_element_count = 0;
  baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  baggage._M_h._M_rehash_policy._M_next_resize = 0;
  baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (lVar6 = -(ulong)((int)gen + 1); lVar6 != 0; lVar6 = lVar6 + 1) {
    (anonymous_namespace)::
    randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              ((string *)&ctx,(_anonymous_namespace_ *)&local_1700,gen);
    (anonymous_namespace)::
    randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              (&value,(_anonymous_namespace_ *)&local_1700,gen_00);
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&baggage,(key_type *)&ctx);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&ctx);
    gen = extraout_RDX;
  }
  gtest_ar._0_8_ = (local_1700 * 0x41a7) % 0x7fffffff;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((ulong)(gtest_ar._0_8_ * 0x41a7) % 0x7fffffff);
  pcVar5 = "";
  gtest_ar.message_.ptr_ = pbVar4;
  std::__cxx11::string::string((string *)&value,"",local_1718);
  uVar1 = (ulong)((long)pbVar4 * 0x41a7) % 0x7fffffff;
  SpanContext::SpanContext
            (&ctx,(TraceID *)&gtest_ar,uVar1,(uVar1 * 0x41a7) % 0x7fffffff,'\0',&baggage,&value);
  std::__cxx11::string::~string((string *)&value);
  BinaryPropagator::inject(&binaryPropagator,&ctx,local_1530);
  BinaryPropagator::extract((SpanContext *)&value,&binaryPropagator,(istream *)&ss);
  testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
            ((internal *)&gtest_ar,"ctx","binaryPropagator.extract(ss)",&ctx,(SpanContext *)&value);
  SpanContext::~SpanContext((SpanContext *)&value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&value);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1718,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/propagation/PropagatorTest.cpp"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1718,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1718);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&value);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  SpanContext::~SpanContext(&ctx);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&baggage._M_h);
  std::random_device::~random_device(&randomDevice);
  BinaryPropagator::~BinaryPropagator(&binaryPropagator);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

TEST(Propagator, testBinaryPropagation)
{
    std::stringstream ss;
    BinaryPropagator binaryPropagator;
    std::random_device randomDevice;
    std::default_random_engine engine(randomDevice());
    constexpr auto kMaxNumBaggageItems = 10;
    const auto numBaggageItems = engine() % (kMaxNumBaggageItems - 1) + 1;
    SpanContext::StrMap baggage;
    for (auto i = static_cast<size_t>(0); i < numBaggageItems; ++i) {
        const auto key = randomStr(engine);
        const auto value = randomStr(engine);
        baggage[key] = value;
    }
    SpanContext ctx(
        TraceID(engine(), engine()), engine(), engine(), 0, baggage);
    binaryPropagator.inject(ctx, ss);
    ASSERT_EQ(ctx, binaryPropagator.extract(ss));
}